

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.hpp
# Opt level: O2

pair<unsigned_long,_unsigned_long>
beast::detail::base64::decode<void>(void *dest,char *src,size_t len)

{
  void *pvVar1;
  int iVar2;
  char *pcVar3;
  int iVar4;
  size_t sVar5;
  long lVar6;
  ulong uVar7;
  pair<unsigned_long,_unsigned_long> pVar8;
  byte local_f [8];
  uchar c3 [3];
  uchar c4 [4];
  
  pvVar1 = dest;
  pcVar3 = src;
  do {
    sVar5 = 0;
    do {
      if (((len == sVar5) || ((ulong)(byte)pcVar3[sVar5] == 0x3d)) ||
         (get_inverse()::tab[(byte)pcVar3[sVar5]] == 0xff)) {
        iVar4 = (int)sVar5;
        if (iVar4 != 0) {
          local_f[0] = (byte)(CONCAT71(0x28be,local_f[4]) >> 4) & 3 | local_f[3] << 2;
          local_f[1] = local_f[5] >> 2 & 0xf | local_f[4] << 4;
          local_f[2] = local_f[5] * '@' + local_f[6];
          iVar2 = 1;
          if (1 < iVar4) {
            iVar2 = iVar4;
          }
          for (uVar7 = 0; iVar2 - 1 != uVar7; uVar7 = uVar7 + 1) {
            *(byte *)((long)pvVar1 + uVar7) = local_f[uVar7];
          }
          pvVar1 = (void *)((long)pvVar1 + uVar7);
        }
        pVar8.first = (long)pvVar1 - (long)dest;
        pVar8.second = pcVar3 + (sVar5 - (long)src);
        return pVar8;
      }
      local_f[sVar5 + 3] = get_inverse()::tab[(byte)pcVar3[sVar5]];
      sVar5 = sVar5 + 1;
    } while ((int)sVar5 != 4);
    local_f[0] = local_f[4] >> 4 & 3 | local_f[3] << 2;
    local_f[1] = local_f[5] >> 2 & 0xf | local_f[4] << 4;
    local_f[2] = local_f[5] * '@' + local_f[6];
    pcVar3 = pcVar3 + sVar5;
    len = len - sVar5;
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      *(byte *)((long)pvVar1 + lVar6) = local_f[lVar6];
    }
    pvVar1 = (void *)((long)pvVar1 + 3);
  } while( true );
}

Assistant:

std::pair<std::size_t, std::size_t>
decode(void* dest, char const* src, std::size_t len)
{
    char* out = static_cast<char*>(dest);
    auto in = reinterpret_cast<unsigned char const*>(src);
    unsigned char c3[3], c4[4];
    int i = 0;
    int j = 0;

    auto const inverse = base64::get_inverse();

    while(len-- && *in != '=')
    {
        auto const v = inverse[*in];
        if(v == -1)
            break;
        ++in;
        c4[i] = v;
        if(++i == 4)
        {
            c3[0] =  (c4[0]        << 2) + ((c4[1] & 0x30) >> 4);
            c3[1] = ((c4[1] & 0xf) << 4) + ((c4[2] & 0x3c) >> 2);
            c3[2] = ((c4[2] & 0x3) << 6) +   c4[3];

            for(i = 0; i < 3; i++)
                *out++ = c3[i];
            i = 0;
        }
    }

    if(i)
    {
        c3[0] = ( c4[0]        << 2) + ((c4[1] & 0x30) >> 4);
        c3[1] = ((c4[1] & 0xf) << 4) + ((c4[2] & 0x3c) >> 2);
        c3[2] = ((c4[2] & 0x3) << 6) +   c4[3];

        for(j = 0; j < i - 1; j++)
            *out++ = c3[j];
    }

    return {out - static_cast<char*>(dest),
        in - reinterpret_cast<unsigned char const*>(src)};
}